

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

void draw_arrow(Fl_Color col)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,col);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe4cccccccccccd,0x3fb999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3ff0000000000000,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe4cccccccccccd,0xbfb999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x19])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbff0000000000000,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3fe4cccccccccccd,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x23])();
  FVar1 = fl_color_average(col,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x19])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0xbff0000000000000,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3fe4cccccccccccd,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x23])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe4cccccccccccd,0x3fb999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0x3ff0000000000000,0);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe4cccccccccccd,0xbfb999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void draw_arrow(Fl_Color col)
{
  fl_color(col);
  BP; vv(0.65,0.1); vv(1.0,0.0); vv(0.65,-0.1); EP;
  BL; vv(-1.0,0.0); vv(0.65,0.0); EL;
  set_outline_color(col);
  BL; vv(-1.0,0.0); vv(0.65,0.0); EL;
  BC; vv(0.65,0.1); vv(1.0,0.0); vv(0.65,-0.1); EC;
}